

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O1

int Nwk_ObjFindFanout(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanout)

{
  long lVar1;
  
  if (0 < (long)pObj->nFanouts) {
    lVar1 = 0;
    do {
      if (pObj->pFanio[pObj->nFanins + lVar1] == (Nwk_Obj_t *)0x0) {
        return -1;
      }
      if (pObj->pFanio[pObj->nFanins + lVar1] == pFanout) {
        return (int)lVar1;
      }
      lVar1 = lVar1 + 1;
    } while (pObj->nFanouts != lVar1);
  }
  return -1;
}

Assistant:

int Nwk_ObjFindFanout( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanout )
{  
    Nwk_Obj_t * pTemp;
    int i;
    Nwk_ObjForEachFanout( pObj, pTemp, i )
        if ( pTemp == pFanout )
            return i;
    return -1;
}